

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.hpp
# Opt level: O3

void boost::algorithm::trim_right_if<std::__cxx11::string,boost::algorithm::detail::is_classifiedF>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Input,
               is_classifiedF *IsSpace)

{
  byte bVar1;
  size_type sVar2;
  ushort uVar3;
  ctype *pcVar4;
  pointer pcVar5;
  size_type sVar6;
  locale local_48 [8];
  ushort local_40;
  locale local_38 [8];
  
  pcVar5 = (Input->_M_dataplus)._M_p;
  sVar2 = Input->_M_string_length;
  local_40 = IsSpace->m_Type;
  std::locale::locale(local_38,&IsSpace->m_Locale);
  uVar3 = local_40;
  std::locale::locale(local_48,local_38);
  do {
    sVar6 = sVar2;
    if (sVar6 == 0) goto LAB_001a0151;
    bVar1 = pcVar5[sVar6 - 1];
    pcVar4 = std::use_facet<std::ctype<char>>(local_48);
    sVar2 = sVar6 - 1;
  } while ((uVar3 & *(ushort *)(*(long *)(pcVar4 + 0x30) + (ulong)bVar1 * 2)) != 0);
  pcVar5 = pcVar5 + sVar6;
LAB_001a0151:
  std::locale::~locale(local_48);
  Input->_M_string_length = (long)pcVar5 - (long)(Input->_M_dataplus)._M_p;
  *pcVar5 = '\0';
  std::locale::~locale(local_38);
  return;
}

Assistant:

inline void trim_right_if(SequenceT& Input, PredicateT IsSpace)
        {
            Input.erase(
                ::boost::algorithm::detail::trim_end( 
                    ::boost::begin(Input), 
                    ::boost::end(Input), 
                    IsSpace ),
                ::boost::end(Input)
                );
        }